

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

uint32_t __thiscall nuraft::asio_service::get_active_workers(asio_service *this)

{
  return (this->impl_->num_active_workers_).super___atomic_base<unsigned_int>._M_i;
}

Assistant:

uint32_t asio_service::get_active_workers() {
    return impl_->num_active_workers_.load();
}